

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long in_RDI;
  float fVar4;
  ImVec2 in_stack_ffffffffffffffe0;
  ImRect local_10;
  
  fVar1 = *(float *)(in_RDI + 0x28);
  fVar2 = *(float *)(in_RDI + 0x18);
  fVar3 = *(float *)(in_RDI + 0x1c);
  fVar4 = TitleBarHeight((ImGuiWindow *)in_stack_ffffffffffffffe0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,fVar2 + fVar1,fVar3 + fVar4);
  ImRect::ImRect(&local_10,(ImVec2 *)(in_RDI + 0x18),(ImVec2 *)&stack0xffffffffffffffe0);
  return local_10;
}

Assistant:

ImRect      TitleBarRect() const    { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }